

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SAXParser.cpp
# Opt level: O1

void __thiscall xercesc_4_0::SAXParser::entityDecl(SAXParser *this)

{
  long *plVar1;
  char in_CL;
  long in_RSI;
  
  plVar1 = *(long **)&(this->fAttrList).fAdopt;
  if ((plVar1 != (long *)0x0 && in_CL == '\0') && (*(long *)(in_RSI + 0x28) != 0)) {
    (**(code **)(*plVar1 + 0x18))
              (plVar1,*(undefined8 *)(in_RSI + 0x20),*(undefined8 *)(in_RSI + 0x30),
               *(undefined8 *)(in_RSI + 0x38),*(long *)(in_RSI + 0x28),*(code **)(*plVar1 + 0x18));
    return;
  }
  return;
}

Assistant:

void SAXParser::entityDecl( const   DTDEntityDecl&  entityDecl
                            , const bool
                            , const bool            isIgnored)
{
    //
    //  If we have a DTD handler, and this entity is not ignored, and
    //  its an unparsed entity, then send this one.
    //
    if (fDTDHandler && !isIgnored)
    {
        if (entityDecl.isUnparsed())
        {
            fDTDHandler->unparsedEntityDecl
            (
                entityDecl.getName()
                , entityDecl.getPublicId()
                , entityDecl.getSystemId()
                , entityDecl.getNotationName()
            );
        }
    }
}